

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O1

ulong __thiscall smf::MidiFile::readVLValue(MidiFile *this,istream *input)

{
  uchar uVar1;
  ulong uVar2;
  ulong uVar3;
  long lVar4;
  bool bVar5;
  uchar b [5];
  uchar local_20 [8];
  
  local_20[4] = '\0';
  local_20[0] = '\0';
  local_20[1] = '\0';
  local_20[2] = '\0';
  local_20[3] = '\0';
  lVar4 = 0;
  do {
    uVar1 = readByte(this,input);
    local_20[lVar4] = uVar1;
    uVar2 = (ulong)this->m_rwstatus;
    if ((uVar2 == 0) || (-1 < (char)uVar1)) break;
    bVar5 = lVar4 != 4;
    lVar4 = lVar4 + 1;
  } while (bVar5);
  if (uVar2 != 0) {
    uVar3 = unpackVLV(this,local_20[0],local_20[1],local_20[2],local_20[3],local_20[4]);
    return uVar3;
  }
  return uVar2;
}

Assistant:

ulong MidiFile::readVLValue(std::istream& input) {
	uchar b[5] = {0};

	for (int i=0; i<5; i++) {
		b[i] = readByte(input);
		if (!status()) { return m_rwstatus; }
		if (b[i] < 0x80) {
			break;
		}
	}

	return unpackVLV(b[0], b[1], b[2], b[3], b[4]);
}